

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O1

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmFunctionBlocker *this_00;
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *this_01;
  int iVar3;
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  string *psVar10;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> _Var11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  value_type *__x;
  char cVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  string *__x_00;
  ulong uVar20;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  anon_class_16_2_5155b745 __gen;
  int step;
  int stop;
  int cc;
  string __str;
  string __str_1;
  int local_110;
  int local_10c;
  undefined1 local_108 [32];
  size_type local_e8;
  pointer local_e0;
  undefined8 local_d8;
  long *local_d0;
  long *local_c8;
  cmMakefile *local_c0;
  undefined1 local_b8 [48];
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_88;
  long local_80;
  string local_78;
  long *local_58;
  uint local_50;
  undefined4 uStack_4c;
  long local_48 [2];
  ulong local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    return false;
  }
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                    (pbVar1,pbVar2,"IN");
  this_01 = status->Makefile;
  if (_Var9._M_current !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_c8 = (long *)operator_new(200);
    local_c8[1] = (long)(local_c8 + 3);
    local_c8[2] = 0;
    *(undefined1 *)(local_c8 + 3) = 0;
    local_c8[5] = (long)(local_c8 + 7);
    local_c8[6] = 0;
    *(undefined1 *)(local_c8 + 7) = 0;
    local_c8[9] = 0;
    *(undefined1 *)(local_c8 + 0xe) = 0;
    local_c8[0xf] = 0;
    local_c8[0x10] = 0;
    local_c8[0x11] = 0;
    *(undefined4 *)(local_c8 + 0x12) = 1;
    *local_c8 = (long)&PTR__cmForEachFunctionBlocker_0085aeb0;
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_c8 + 0x13);
    local_c8[0x13] = 0;
    local_c8[0x14] = 0;
    local_c8[0x15] = 0;
    local_c8[0x16] = (long)this_01;
    local_c8[0x17] = 0;
    *(undefined1 *)(local_c8 + 0x18) = 0;
    cmMakefile::PushLoopBlock(this_01);
    __x = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)_Var9._M_current - (long)__x >> 5;
    if (0 < lVar14) {
      lVar14 = lVar14 + 1;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this,__x);
        __x = __x + 1;
        lVar14 = lVar14 + -1;
      } while (1 < lVar14);
    }
    local_80 = local_c8[0x14] - local_c8[0x13];
    local_38 = local_80 >> 5;
    local_c8[0x17] = local_38;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar19 = 0;
    local_c0 = this_01;
    do {
      __x_00 = _Var9._M_current + 1;
      if (__x_00 == pbVar1) break;
      iVar7 = std::__cxx11::string::compare((char *)__x_00);
      if (iVar7 == 0) {
        if (uVar19 != 3) {
          if (local_80 == 0x20) {
            uVar19 = 1;
            goto LAB_001f871a;
          }
          local_108._0_8_ = local_108 + 0x10;
          local_b8._0_8_ = (char *)0x35;
          local_108._0_8_ = std::__cxx11::string::_M_create((ulong *)local_108,(ulong)local_b8);
          local_108._16_8_ = local_b8._0_8_;
          builtin_strncpy((char *)local_108._0_8_,
                          "ITEMS or LISTS require exactly one iteration variable",0x35);
          local_108._8_8_ = local_b8._0_8_;
          *(char *)(local_108._0_8_ + local_b8._0_8_) = '\0';
          cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_108);
          goto LAB_001f86e8;
        }
        local_108._0_8_ = local_108 + 0x10;
        local_b8._0_8_ = (char *)0x2d;
        local_108._0_8_ = std::__cxx11::string::_M_create((ulong *)local_108,(ulong)local_b8);
        local_108._16_8_ = local_b8._0_8_;
        builtin_strncpy((char *)local_108._0_8_,"ZIP_LISTS can not be used with LISTS or ITEMS",0x2d
                       );
        local_108._8_8_ = local_b8._0_8_;
        *(char *)(local_108._0_8_ + local_b8._0_8_) = '\0';
        cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_108);
LAB_001f8453:
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        uVar19 = 3;
LAB_001f8704:
        bVar6 = false;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)__x_00);
        if (iVar7 == 0) {
          if (uVar19 == 3) {
            local_108._0_8_ = local_108 + 0x10;
            local_b8._0_8_ = (char *)0x2d;
            local_108._0_8_ = std::__cxx11::string::_M_create((ulong *)local_108,(ulong)local_b8);
            local_108._16_8_ = local_b8._0_8_;
            builtin_strncpy((char *)local_108._0_8_,"ZIP_LISTS can not be used with LISTS or ITEMS",
                            0x2d);
            local_108._8_8_ = local_b8._0_8_;
            *(char *)(local_108._0_8_ + local_b8._0_8_) = '\0';
            cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_108);
            goto LAB_001f8453;
          }
          if (local_80 == 0x20) {
            uVar19 = 2;
            goto LAB_001f871a;
          }
          local_108._0_8_ = local_108 + 0x10;
          local_b8._0_8_ = (char *)0x35;
          local_108._0_8_ = std::__cxx11::string::_M_create((ulong *)local_108,(ulong)local_b8);
          local_108._16_8_ = local_b8._0_8_;
          builtin_strncpy((char *)local_108._0_8_,
                          "ITEMS or LISTS require exactly one iteration variable",0x35);
          local_108._8_8_ = local_b8._0_8_;
          *(char *)(local_108._0_8_ + local_b8._0_8_) = '\0';
          cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_108);
LAB_001f86e8:
          pcVar17 = (char *)local_108._16_8_;
          pcVar18 = (char *)local_108._0_8_;
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
LAB_001f86fc:
            operator_delete(pcVar18,(ulong)(pcVar17 + 1));
          }
          goto LAB_001f8704;
        }
        iVar7 = std::__cxx11::string::compare((char *)__x_00);
        if (iVar7 == 0) {
          if (uVar19 != 0) {
            local_108._0_8_ = local_108 + 0x10;
            local_b8._0_8_ = (char *)0x2d;
            local_108._0_8_ = std::__cxx11::string::_M_create((ulong *)local_108,(ulong)local_b8);
            local_108._16_8_ = local_b8._0_8_;
            builtin_strncpy((char *)local_108._0_8_,"ZIP_LISTS can not be used with LISTS or ITEMS",
                            0x2d);
            local_108._8_8_ = local_b8._0_8_;
            *(char *)(local_108._0_8_ + local_b8._0_8_) = '\0';
            cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_108);
            goto LAB_001f86e8;
          }
          *(undefined1 *)(local_c8 + 0x18) = 1;
          uVar19 = 3;
LAB_001f871a:
          bVar6 = true;
        }
        else if (uVar19 == 1) {
          psVar10 = cmMakefile::GetSafeDefinition(local_c0,__x_00);
          bVar6 = true;
          if (psVar10->_M_string_length == 0) {
            uVar19 = 1;
          }
          else {
            uVar19 = 1;
            arg._M_str = (psVar10->_M_dataplus)._M_p;
            arg._M_len = psVar10->_M_string_length;
            cmExpandList(arg,this,true);
          }
        }
        else {
          if ((uVar19 & 0xfffffffe) != 2) {
            local_108._0_8_ = (char *)0x12;
            local_108._8_8_ = "Unknown argument:\n";
            local_108._16_8_ = &DAT_00000002;
            local_108._24_8_ = (long)"RPATH_REMOVE could not remove RPATH from file: \n  " + 0x30;
            local_e0 = (__x_00->_M_dataplus)._M_p;
            local_e8 = _Var9._M_current[1]._M_string_length;
            local_d8 = 1;
            local_d0 = (long *)0x6b3282;
            views._M_len = 4;
            views._M_array = (iterator)local_108;
            cmCatViews_abi_cxx11_((string *)local_b8,views);
            cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_b8);
            pcVar17 = (char *)local_b8._16_8_;
            pcVar18 = (char *)local_b8._0_8_;
            if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) goto LAB_001f8704;
            goto LAB_001f86fc;
          }
          bVar6 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,__x_00);
        }
      }
      _Var9._M_current = __x_00;
    } while (bVar6);
    uVar20 = local_38;
    plVar15 = local_c8;
    if (__x_00 == pbVar1) {
      if ((local_38 < 2 || uVar19 != 3) || (local_80 >> 4 == local_c8[0x14] - local_c8[0x13] >> 5))
      {
        local_108._0_8_ = local_c8;
        cmMakefile::AddFunctionBlocker
                  (local_c0,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                             *)local_108);
        if ((long *)local_108._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_108._0_8_ + 8))();
        }
        local_108._0_8_ = (char *)0x0;
        plVar15 = (long *)0x0;
      }
      else {
        cVar16 = '\x01';
        if (9 < local_38) {
          uVar13 = local_38;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (uVar13 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_001f8ab5;
            }
            if (uVar13 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_001f8ab5;
            }
            if (uVar13 < 10000) goto LAB_001f8ab5;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_001f8ab5:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_78,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,uVar20);
        _Var4._M_p = local_78._M_dataplus._M_p;
        uVar20 = (plVar15[0x14] - plVar15[0x13] >> 5) - uVar20;
        cVar16 = '\x01';
        if (9 < uVar20) {
          uVar13 = uVar20;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (uVar13 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_001f8b59;
            }
            if (uVar13 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_001f8b59;
            }
            if (uVar13 < 10000) goto LAB_001f8b59;
            bVar6 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_001f8b59:
        local_58 = local_48;
        std::__cxx11::string::_M_construct((ulong)&local_58,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_58,local_50,uVar20);
        local_108._0_8_ = (char *)0x9;
        local_108._8_8_ = "Expected ";
        local_108._24_8_ = _Var4._M_p;
        local_e8 = 0x1b;
        local_e0 = " list variables, but given ";
        local_d8 = CONCAT44(uStack_4c,local_50);
        local_d0 = local_58;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_108;
        local_108._16_8_ =
             (char *)CONCAT44(local_78._M_string_length._4_4_,(uint)local_78._M_string_length);
        cmCatViews_abi_cxx11_((string *)local_b8,views_00);
        cmMakefile::IssueMessage(local_c0,FATAL_ERROR,(string *)local_b8);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        plVar15 = local_c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (plVar15 != (long *)0x0) {
      (**(code **)(*plVar15 + 8))(plVar15);
    }
    return true;
  }
  _Var11._M_head_impl = (cmFunctionBlocker *)operator_new(200);
  ((_Var11._M_head_impl)->StartingContext).Name._M_dataplus._M_p =
       (pointer)&((_Var11._M_head_impl)->StartingContext).Name.field_2;
  ((_Var11._M_head_impl)->StartingContext).Name._M_string_length = 0;
  ((_Var11._M_head_impl)->StartingContext).Name.field_2._M_local_buf[0] = '\0';
  ((_Var11._M_head_impl)->StartingContext).FilePath._M_dataplus._M_p =
       (pointer)&((_Var11._M_head_impl)->StartingContext).FilePath.field_2;
  ((_Var11._M_head_impl)->StartingContext).FilePath._M_string_length = 0;
  ((_Var11._M_head_impl)->StartingContext).FilePath.field_2._M_local_buf[0] = '\0';
  ((_Var11._M_head_impl)->StartingContext).Line = 0;
  ((_Var11._M_head_impl)->StartingContext).DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var11._M_head_impl)->Functions).
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var11._M_head_impl)->ScopeDepth = 1;
  (_Var11._M_head_impl)->_vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmForEachFunctionBlocker_0085aeb0;
  this_00 = _Var11._M_head_impl + 1;
  _Var11._M_head_impl[1]._vptr_cmFunctionBlocker = (_func_int **)0x0;
  _Var11._M_head_impl[1].StartingContext.Name._M_dataplus._M_p = (pointer)0x0;
  _Var11._M_head_impl[1].StartingContext.Name._M_string_length = 0;
  *(cmMakefile **)&_Var11._M_head_impl[1].StartingContext.Name.field_2 = this_01;
  *(undefined8 *)((long)&_Var11._M_head_impl[1].StartingContext.Name.field_2 + 8) = 0;
  *(undefined1 *)&_Var11._M_head_impl[1].StartingContext.FilePath._M_dataplus._M_p = 0;
  cmMakefile::PushLoopBlock(this_01);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) ||
     (iVar7 = std::__cxx11::string::compare((char *)(pbVar1 + 1)), iVar7 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,args);
LAB_001f8850:
    *(undefined8 *)((long)&_Var11._M_head_impl[1].StartingContext.Name.field_2 + 8) = 1;
    local_88._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)_Var11._M_head_impl;
    cmMakefile::AddFunctionBlocker
              (status->Makefile,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_88);
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_88._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
    local_88._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    bVar6 = true;
    _Var11._M_head_impl = (cmFunctionBlocker *)0x0;
  }
  else {
    local_58 = (long *)((ulong)local_58 & 0xffffffff00000000);
    local_10c = 0;
    local_110 = 0;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) ||
         (bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger(status,pbVar1 + 2,&local_10c), bVar6))
        && ((pbVar1 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
            (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x80 ||
            ((bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger(status,pbVar1 + 2,(int *)&local_58)
             , bVar6 &&
             (bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger
                                (status,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 3,&local_10c),
             bVar6)))))) &&
       ((pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0xa0 ||
        (((bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger(status,pbVar1 + 2,(int *)&local_58),
          bVar6 && (bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger
                                      (status,(args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + 3,
                                       &local_10c), bVar6)) &&
         (bVar6 = anon_unknown.dwarf_58c74f::TryParseInteger
                            (status,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 4,&local_110),
         bVar6)))))) {
      iVar7 = (int)local_58;
      if (local_110 == 0) {
        if (local_10c < (int)local_58) {
          local_110 = -1;
        }
        else {
          local_110 = 1;
        }
      }
      if (((int)local_58 <= local_10c || local_110 < 1) &&
         ((-1 < local_110 || local_10c <= (int)local_58) && local_110 != 0)) {
        iVar8 = (int)local_58 - local_10c;
        iVar12 = 0;
        if (iVar8 != 0 && local_10c <= (int)local_58) {
          iVar12 = iVar8;
        }
        iVar8 = -iVar8;
        if (local_10c <= (int)local_58) {
          iVar8 = 0;
        }
        iVar3 = -local_110;
        if (0 < local_110) {
          iVar3 = local_110;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,(ulong)(iVar8 / iVar3 + iVar12 / iVar3 + 2));
        std::__cxx11::string::_M_assign
                  ((string *)
                   (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&this_00->_vptr_cmFunctionBlocker)->_M_impl).super__Vector_impl_data.
                   _M_start);
        local_108._0_4_ = iVar7;
        __gen.step = local_110;
        __gen.cc = (int *)local_108;
        __gen._12_4_ = 0;
        std::
        generate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmForEachCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (_Var11._M_head_impl[1]._vptr_cmFunctionBlocker + 4),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Var11._M_head_impl[1].StartingContext.Name._M_dataplus._M_p,__gen);
        goto LAB_001f8850;
      }
      local_108._0_8_ = (char *)0x31;
      local_108._8_8_ = "called with incorrect range specification: start ";
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_b8,(int)local_58);
      cmStrCat<char[8],int,char[8],int>
                (&local_78,(cmAlphaNum *)local_108,(cmAlphaNum *)local_b8,(char (*) [8])", stop ",
                 &local_10c,(char (*) [8])", step ",&local_110);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    bVar6 = false;
  }
  if (_Var11._M_head_impl != (cmFunctionBlocker *)0x0) {
    (**(code **)(*(long *)_Var11._M_head_impl + 8))(_Var11._M_head_impl);
  }
  return bVar6;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}